

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkAllocVectors(ARKodeMem ark_mem,N_Vector tmpl)

{
  int iVar1;
  N_Vector *in_RSI;
  N_Vector in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = arkAllocVec((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,in_RSI);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if (*(int *)&in_RDI[0x16].sunctx != 0) {
      in_RDI[0x16].ops = (N_Vector_Ops)in_RDI[0x16].content;
    }
    iVar1 = arkAllocVec((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,in_RSI);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = arkAllocVec((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,in_RSI);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = arkAllocVec((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                            ,in_RDI,in_RSI);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = arkAllocVec((ARKodeMem)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
          if (iVar1 == 0) {
            iVar1 = 0;
          }
          else {
            iVar1 = arkAllocVec((ARKodeMem)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,in_RSI);
            if (iVar1 == 0) {
              iVar1 = 0;
            }
            else {
              iVar1 = 1;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

sunbooleantype arkAllocVectors(ARKodeMem ark_mem, N_Vector tmpl)
{
  /* Allocate ewt if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->ewt)) { return (SUNFALSE); }

  /* Set rwt to point at ewt */
  if (ark_mem->rwt_is_ewt) { ark_mem->rwt = ark_mem->ewt; }

  /* Allocate yn if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->yn)) { return (SUNFALSE); }

  /* Allocate tempv1 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv1)) { return (SUNFALSE); }

  /* Allocate tempv2 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv2)) { return (SUNFALSE); }

  /* Allocate tempv3 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv3)) { return (SUNFALSE); }

  /* Allocate tempv4 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv4)) { return (SUNFALSE); }

  return (SUNTRUE);
}